

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

void __thiscall ConditionalEstimator::collect(ConditionalEstimator *this)

{
  bool bVar1;
  int iVar2;
  bool *pbVar3;
  double *pdVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  byte local_c1;
  double local_b8;
  int local_a0;
  int bin_1;
  int i_10;
  double d_3;
  int i_9;
  double d_2;
  int i_8;
  int local_74;
  int i_7;
  int local_6c;
  int i_6;
  double cnd;
  int local_58;
  int bin;
  int i_5;
  double d_1;
  int i_4;
  double d;
  int i_3;
  int local_2c;
  int i_2;
  int local_24;
  int i_1;
  int local_1c;
  int i;
  double rnd;
  ConditionalEstimator *this_local;
  
  rnd = (double)this;
  if (((this->super_Estimator).nEstimate & 0x40U) == 0) {
    (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric[8])();
    local_b8 = extraout_XMM0_Qa_00;
  }
  else {
    (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric[7])();
    local_b8 = extraout_XMM0_Qa;
  }
  _i = local_b8;
  Ring<double>::next(&this->condSampleRing,local_b8);
  if (this->condTrigger == (StochasticEventGenerator *)0x0) {
    Ring<double>::next(&this->condConditionRing,_i);
    bVar1 = Ring<double>::isInitialized(&this->condSampleRing);
    if (bVar1) {
      local_6c = this->nPre + -1;
      pdVar4 = Ring<double>::operator[](&this->condConditionRing,&local_6c);
      _i_6 = *pdVar4;
      (this->super_Estimator).nSamples = (this->super_Estimator).nSamples + 1;
      if (((this->super_Estimator).nEstimate & 1U) != 0) {
        for (i_7 = 0; i_7 < this->nPre + this->nPost + 1; i_7 = i_7 + 1) {
          local_74 = i_7 + 1;
          pdVar4 = Ring<double>::operator[](&this->condSampleRing,&local_74);
          this->condSamples[i_7] = *pdVar4 * _i_6;
        }
      }
      if (((this->super_Estimator).nEstimate & 4U) != 0) {
        for (i_8 = 0; i_8 < this->nPre + this->nPost + 1; i_8 = i_8 + 1) {
          d_2._4_4_ = i_8 + 1;
          pdVar4 = Ring<double>::operator[](&this->condSampleRing,(int *)((long)&d_2 + 4));
          this->aOne[i_8] = *pdVar4 * _i_6 + this->aOne[i_8];
        }
      }
      if (((this->super_Estimator).nEstimate & 8U) != 0) {
        for (d_2._0_4_ = 0; d_2._0_4_ < this->nPre + this->nPost + 1; d_2._0_4_ = d_2._0_4_ + 1) {
          d_3._4_4_ = d_2._0_4_ + 1;
          pdVar4 = Ring<double>::operator[](&this->condSampleRing,(int *)((long)&d_3 + 4));
          _i_9 = *pdVar4;
          this->aTwo[d_2._0_4_] = _i_9 * _i_9 * _i_6 + this->aTwo[d_2._0_4_];
        }
      }
      if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
        for (d_3._0_4_ = 0; d_3._0_4_ < this->nPre + this->nPost + 1; d_3._0_4_ = d_3._0_4_ + 1) {
          bin_1 = d_3._0_4_ + 1;
          pdVar4 = Ring<double>::operator[](&this->condSampleRing,&bin_1);
          _i_10 = *pdVar4;
          this->aThree[d_3._0_4_] = _i_10 * _i_10 * _i_10 * _i_6 + this->aThree[d_3._0_4_];
        }
      }
      if (((this->super_Estimator).nEstimate & 2U) != 0) {
        for (local_a0 = 0; local_a0 < this->nPre + this->nPost + 1; local_a0 = local_a0 + 1) {
          pdVar4 = Ring<double>::operator[](&this->condSampleRing,&local_a0);
          dVar5 = floor((*pdVar4 * _i_6 + -this->dDistOffset) / this->dDistScale + 0.5);
          iVar2 = (int)dVar5;
          if ((iVar2 <= this->nDist) && (-1 < iVar2)) {
            this->aDist[local_a0][iVar2] = this->aDist[local_a0][iVar2] + 1.0;
          }
        }
      }
    }
  }
  else {
    iVar2 = (*(this->condTrigger->super_StochasticVariable).super_StochasticProcess.super_Parametric
              ._vptr_Parametric[0xf])();
    Ring<bool>::next(&this->condEventRing,(bool)((byte)iVar2 & 1));
    bVar1 = Ring<double>::isInitialized(&this->condSampleRing);
    if (bVar1) {
      local_1c = this->nPre + 1 + this->nUpdateCorrection;
      pbVar3 = Ring<bool>::operator[](&this->condEventRing,&local_1c);
      local_c1 = 0;
      if ((*pbVar3 & 1U) != 0) {
        bVar1 = hasAdditionalEvents(this);
        local_c1 = bVar1 ^ 0xff;
      }
      if ((local_c1 & 1) != 0) {
        (this->super_Estimator).nSamples = (this->super_Estimator).nSamples + 1;
        if (((this->super_Estimator).nEstimate & 1U) != 0) {
          for (i_1 = 0; i_1 < this->nPre + this->nPost + 1; i_1 = i_1 + 1) {
            local_24 = i_1 + 1;
            pdVar4 = Ring<double>::operator[](&this->condSampleRing,&local_24);
            this->condSamples[i_1] = *pdVar4;
          }
        }
        if (((this->super_Estimator).nEstimate & 4U) != 0) {
          for (i_2 = 0; i_2 < this->nPre + this->nPost + 1; i_2 = i_2 + 1) {
            local_2c = i_2 + 1;
            pdVar4 = Ring<double>::operator[](&this->condSampleRing,&local_2c);
            this->aOne[i_2] = *pdVar4 + this->aOne[i_2];
          }
        }
        if (((this->super_Estimator).nEstimate & 0x20U) != 0) {
          for (i_3 = 0; i_3 < this->nPre + this->nPost + 1; i_3 = i_3 + 1) {
            d._4_4_ = i_3 + 1;
            pbVar3 = Ring<bool>::operator[](&this->condEventRing,(int *)((long)&d + 4));
            this->aEvents[i_3] = (double)(*pbVar3 & 1) + this->aEvents[i_3];
          }
        }
        if (((this->super_Estimator).nEstimate & 8U) != 0) {
          for (d._0_4_ = 0; d._0_4_ < this->nPre + this->nPost + 1; d._0_4_ = d._0_4_ + 1) {
            d_1._4_4_ = d._0_4_ + 1;
            pdVar4 = Ring<double>::operator[](&this->condSampleRing,(int *)((long)&d_1 + 4));
            _i_4 = *pdVar4;
            this->aTwo[d._0_4_] = _i_4 * _i_4 + this->aTwo[d._0_4_];
          }
        }
        if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
          for (d_1._0_4_ = 0; d_1._0_4_ < this->nPre + this->nPost + 1; d_1._0_4_ = d_1._0_4_ + 1) {
            bin = d_1._0_4_ + 1;
            pdVar4 = Ring<double>::operator[](&this->condSampleRing,&bin);
            _i_5 = *pdVar4;
            this->aThree[d_1._0_4_] = _i_5 * _i_5 * _i_5 + this->aThree[d_1._0_4_];
          }
        }
        if (((this->super_Estimator).nEstimate & 2U) != 0) {
          for (local_58 = 0; local_58 < this->nPre + this->nPost + 1; local_58 = local_58 + 1) {
            cnd._0_4_ = local_58 + 1;
            pdVar4 = Ring<double>::operator[](&this->condSampleRing,(int *)&cnd);
            dVar5 = floor((*pdVar4 - this->dDistOffset) / this->dDistScale + 0.5);
            cnd._4_4_ = (int)dVar5;
            if ((cnd._4_4_ < this->nDist) && (-1 < cnd._4_4_)) {
              this->aDist[local_58][cnd._4_4_] = this->aDist[local_58][cnd._4_4_] + 1.0;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ConditionalEstimator::collect()
{
	// eat next data point, without stepping stoch. variable
	double rnd = nEstimate & EST_DIFF ? pSource->getIncrement() : pSource->getCurrentValue();
	condSampleRing.next( rnd);
	
	// get next event, and write it into event cycle	
	if (condTrigger) {
		condEventRing.next( condTrigger->hasEvent() );
		
		// if an event has occured nPost steps ago, record all properties
		if (condSampleRing.isInitialized()) {
			if( condEventRing[nPre+1+nUpdateCorrection] && !hasAdditionalEvents() ) { // nPre+1 is equivalent to -nPost in a ring
				++nSamples;
				if( nEstimate & EST_SAMPLE )
					for(int i=0; i<nPre+nPost+1; i++)
						condSamples[i] = condSampleRing[i+1];
				if( nEstimate & EST_MEAN )
					for(int i=0; i<nPre+nPost+1; i++)
						aOne[i] += condSampleRing[i+1];
				if( nEstimate & EST_EVENTS )
					for(int i=0; i<nPre+nPost+1; i++)
						aEvents[i] += condEventRing[i+1];
				if( nEstimate & EST_VAR )
					for(int i=0; i<nPre+nPost+1; i++) {
						double d = condSampleRing[i+1];
						aTwo[i] += d*d;
					}
				if( nEstimate & EST_CUR )
					for(int i=0; i<nPre+nPost+1; i++) {
						double d = condSampleRing[i+1];
						aThree[i] += d*d*d;
					}
				if( nEstimate & EST_DENS )
					for(int i=0; i<nPre+nPost+1; i++) {
						int bin = (int) floor( (condSampleRing[i+1] - dDistOffset) / dDistScale + 0.5); // round
						if( (bin < nDist) && (bin >= 0) )
							aDist[ i ][ bin ]++;
					}
			}
		}
	} 
	else {
		condConditionRing.next( rnd /*condCondition->getIncrement()*/ );
			   
		// record all properties mulitplied with the condition at the time of recording
		if (condSampleRing.isInitialized()) {
			double cnd = condConditionRing[nPre+1-2]; // nPre+1 is equivalent to -nPost in a ring, the '2' accounts for update delays			
			++nSamples;
			if( nEstimate & EST_SAMPLE )
				for(int i=0; i<nPre+nPost+1; i++)
					condSamples[i] = condSampleRing[i+1] * cnd;
			if( nEstimate & EST_MEAN )
				for(int i=0; i<nPre+nPost+1; i++)
					aOne[i] += condSampleRing[i+1] * cnd;
			if( nEstimate & EST_VAR )
				for(int i=0; i<nPre+nPost+1; i++) {
					double d = condSampleRing[i+1];
					aTwo[i] += d*d*cnd;
				}
			if( nEstimate & EST_CUR )
				for(int i=0; i<nPre+nPost+1; i++) {
					double d = condSampleRing[i+1];
					aThree[i] += d*d*d*cnd;
				}
			if( nEstimate & EST_DENS )
				for(int i=0; i<nPre+nPost+1; i++) {
					int bin = (int) floor( (condSampleRing[i]*cnd - dDistOffset) / dDistScale + 0.5 ); // round
					if( (bin <= nDist) && (bin >= 0) )
						aDist[ i ][ bin ]++;
				}
		}
	}
}